

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O3

int uv_signal_start(uv_signal_t *handle,uv_signal_cb signal_cb,int signum)

{
  uint *puVar1;
  uint uVar2;
  uv__signal_tree_s uVar3;
  uv_signal_s *puVar4;
  uv_signal_s *puVar5;
  int iVar6;
  uv_signal_t *puVar7;
  uv_signal_s *puVar8;
  uv_signal_s *puVar9;
  int *piVar10;
  long lVar11;
  anon_struct_32_4_548b78d9_for_tree_entry *paVar12;
  uv_signal_s *puVar13;
  uv__signal_tree_s *puVar14;
  sigset_t saved_sigmask;
  sigset_t sStack_138;
  sigaction local_b8;
  
  if ((handle->flags & 3) != 0) {
    __assert_fail("!(handle->flags & (UV_CLOSING | UV_CLOSED))","src/unix/signal.c",0x123,
                  "int uv_signal_start(uv_signal_t *, uv_signal_cb, int)");
  }
  if (signum == 0) {
    iVar6 = -0x16;
  }
  else if (handle->signum == signum) {
    handle->signal_cb = signal_cb;
    iVar6 = 0;
  }
  else {
    if (handle->signum != 0) {
      uv__signal_stop(handle);
    }
    uv__signal_block_and_lock(&sStack_138);
    puVar7 = uv__signal_first_handle(signum);
    if (puVar7 == (uv_signal_t *)0x0) {
      memset(&local_b8,0,0x98);
      iVar6 = sigfillset(&local_b8.sa_mask);
      if (iVar6 != 0) {
        abort();
      }
      local_b8.__sigaction_handler.sa_handler = uv__signal_handler;
      iVar6 = sigaction(signum,&local_b8,(sigaction *)0x0);
      if (iVar6 != 0) {
        piVar10 = __errno_location();
        iVar6 = *piVar10;
        if (iVar6 != 0) {
          uv__signal_unlock_and_unblock(&sStack_138);
          return -iVar6;
        }
      }
    }
    handle->signum = signum;
    uVar3 = uv__signal_tree;
    if (uv__signal_tree.rbh_root == (uv_signal_s *)0x0) {
      (handle->tree_entry).rbe_left = (uv_signal_s *)0x0;
      (handle->tree_entry).rbe_right = (uv_signal_s *)0x0;
      (handle->tree_entry).rbe_parent = (uv_signal_s *)0x0;
      (handle->tree_entry).rbe_color = 1;
      uv__signal_tree.rbh_root = handle;
    }
    else {
      do {
        puVar8 = uVar3.rbh_root;
        lVar11 = 0x50;
        if (puVar8->signum <= signum) {
          if (puVar8->signum < signum) {
LAB_0010e47d:
            lVar11 = 0x58;
          }
          else if (puVar8->loop <= handle->loop) {
            if (puVar8->loop < handle->loop) goto LAB_0010e47d;
            if ((handle > puVar8 || puVar8 == handle) && (lVar11 = 0x58, handle <= puVar8))
            goto LAB_0010e72f;
          }
        }
        uVar3.rbh_root = *(uv_signal_s **)((long)puVar8->handle_queue + lVar11 + -0x20);
      } while (uVar3.rbh_root != (uv_signal_s *)0x0);
      (handle->tree_entry).rbe_parent = puVar8;
      (handle->tree_entry).rbe_left = (uv_signal_s *)0x0;
      (handle->tree_entry).rbe_right = (uv_signal_s *)0x0;
      (handle->tree_entry).rbe_color = 1;
      *(uv_signal_t **)((long)puVar8->handle_queue + lVar11 + -0x20) = handle;
      puVar7 = handle;
      do {
        if ((puVar8->tree_entry).rbe_color != 1) break;
        puVar4 = (puVar8->tree_entry).rbe_parent;
        puVar13 = (puVar4->tree_entry).rbe_left;
        puVar9 = puVar7;
        if (puVar8 == puVar13) {
          puVar5 = (puVar4->tree_entry).rbe_right;
          if ((puVar5 != (uv_signal_s *)0x0) && ((puVar5->tree_entry).rbe_color == 1)) {
            (puVar5->tree_entry).rbe_color = 0;
            goto LAB_0010e51f;
          }
          puVar5 = (puVar8->tree_entry).rbe_right;
          if (puVar5 == puVar7) {
            puVar13 = (puVar5->tree_entry).rbe_left;
            (puVar8->tree_entry).rbe_right = puVar13;
            if (puVar13 == (uv_signal_s *)0x0) {
              (puVar5->tree_entry).rbe_parent = puVar4;
              puVar13 = (puVar8->tree_entry).rbe_parent;
LAB_0010e615:
              puVar14 = (uv__signal_tree_s *)&(puVar13->tree_entry).rbe_right;
              if (puVar8 == (puVar13->tree_entry).rbe_left) {
                puVar14 = (uv__signal_tree_s *)&puVar13->tree_entry;
              }
            }
            else {
              (puVar13->tree_entry).rbe_parent = puVar8;
              puVar13 = (puVar8->tree_entry).rbe_parent;
              (puVar5->tree_entry).rbe_parent = puVar13;
              puVar14 = &uv__signal_tree;
              if (puVar13 != (uv_signal_s *)0x0) goto LAB_0010e615;
            }
            ((anon_struct_32_4_548b78d9_for_tree_entry *)puVar14)->rbe_left = puVar5;
            (puVar5->tree_entry).rbe_left = puVar8;
            (puVar8->tree_entry).rbe_parent = puVar5;
            puVar13 = (puVar4->tree_entry).rbe_left;
            puVar9 = puVar8;
            puVar8 = puVar7;
          }
          (puVar8->tree_entry).rbe_color = 0;
          (puVar4->tree_entry).rbe_color = 1;
          puVar8 = (puVar13->tree_entry).rbe_right;
          (puVar4->tree_entry).rbe_left = puVar8;
          if (puVar8 != (uv_signal_s *)0x0) {
            (puVar8->tree_entry).rbe_parent = puVar4;
          }
          puVar8 = (puVar4->tree_entry).rbe_parent;
          (puVar13->tree_entry).rbe_parent = puVar8;
          paVar12 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
          if (puVar8 != (uv_signal_s *)0x0) {
            paVar12 = (anon_struct_32_4_548b78d9_for_tree_entry *)&(puVar8->tree_entry).rbe_right;
            if (puVar4 == (puVar8->tree_entry).rbe_left) {
              paVar12 = &puVar8->tree_entry;
            }
          }
          paVar12->rbe_left = puVar13;
          (puVar13->tree_entry).rbe_right = puVar4;
          (puVar4->tree_entry).rbe_parent = puVar13;
        }
        else if ((puVar13 == (uv_signal_s *)0x0) || ((puVar13->tree_entry).rbe_color != 1)) {
          puVar13 = (puVar8->tree_entry).rbe_left;
          if (puVar13 == puVar7) {
            puVar9 = (puVar13->tree_entry).rbe_right;
            (puVar8->tree_entry).rbe_left = puVar9;
            if (puVar9 == (uv_signal_s *)0x0) {
              (puVar13->tree_entry).rbe_parent = puVar4;
              puVar9 = (puVar8->tree_entry).rbe_parent;
LAB_0010e59e:
              puVar14 = (uv__signal_tree_s *)&(puVar9->tree_entry).rbe_right;
              if (puVar8 == (puVar9->tree_entry).rbe_left) {
                puVar14 = (uv__signal_tree_s *)&puVar9->tree_entry;
              }
            }
            else {
              (puVar9->tree_entry).rbe_parent = puVar8;
              puVar9 = (puVar8->tree_entry).rbe_parent;
              (puVar13->tree_entry).rbe_parent = puVar9;
              puVar14 = &uv__signal_tree;
              if (puVar9 != (uv_signal_s *)0x0) goto LAB_0010e59e;
            }
            ((anon_struct_32_4_548b78d9_for_tree_entry *)puVar14)->rbe_left = puVar13;
            (puVar13->tree_entry).rbe_right = puVar8;
            (puVar8->tree_entry).rbe_parent = puVar13;
            puVar9 = puVar8;
            puVar8 = puVar7;
          }
          (puVar8->tree_entry).rbe_color = 0;
          (puVar4->tree_entry).rbe_color = 1;
          puVar8 = (puVar4->tree_entry).rbe_right;
          puVar13 = (puVar8->tree_entry).rbe_left;
          (puVar4->tree_entry).rbe_right = puVar13;
          if (puVar13 != (uv_signal_s *)0x0) {
            (puVar13->tree_entry).rbe_parent = puVar4;
          }
          puVar13 = (puVar4->tree_entry).rbe_parent;
          (puVar8->tree_entry).rbe_parent = puVar13;
          paVar12 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
          if (puVar13 != (uv_signal_s *)0x0) {
            paVar12 = (anon_struct_32_4_548b78d9_for_tree_entry *)&(puVar13->tree_entry).rbe_right;
            if (puVar4 == (puVar13->tree_entry).rbe_left) {
              paVar12 = &puVar13->tree_entry;
            }
          }
          paVar12->rbe_left = puVar8;
          (puVar8->tree_entry).rbe_left = puVar4;
          (puVar4->tree_entry).rbe_parent = puVar8;
        }
        else {
          (puVar13->tree_entry).rbe_color = 0;
LAB_0010e51f:
          (puVar8->tree_entry).rbe_color = 0;
          (puVar4->tree_entry).rbe_color = 1;
          puVar9 = puVar4;
        }
        puVar8 = (puVar9->tree_entry).rbe_parent;
        puVar7 = puVar9;
      } while (puVar8 != (uv_signal_s *)0x0);
    }
    ((uv__signal_tree.rbh_root)->tree_entry).rbe_color = 0;
LAB_0010e72f:
    uv__signal_unlock_and_unblock(&sStack_138);
    handle->signal_cb = signal_cb;
    uVar2 = handle->flags;
    iVar6 = 0;
    if (((uVar2 >> 0xe & 1) == 0) && (handle->flags = uVar2 | 0x4000, (uVar2 >> 0xd & 1) != 0)) {
      puVar1 = &handle->loop->active_handles;
      *puVar1 = *puVar1 + 1;
    }
  }
  return iVar6;
}

Assistant:

int uv_signal_start(uv_signal_t* handle, uv_signal_cb signal_cb, int signum) {
  sigset_t saved_sigmask;
  int err;

  assert(!(handle->flags & (UV_CLOSING | UV_CLOSED)));

  /* If the user supplies signum == 0, then return an error already. If the
   * signum is otherwise invalid then uv__signal_register will find out
   * eventually.
   */
  if (signum == 0)
    return -EINVAL;

  /* Short circuit: if the signal watcher is already watching {signum} don't
   * go through the process of deregistering and registering the handler.
   * Additionally, this avoids pending signals getting lost in the small time
   * time frame that handle->signum == 0.
   */
  if (signum == handle->signum) {
    handle->signal_cb = signal_cb;
    return 0;
  }

  /* If the signal handler was already active, stop it first. */
  if (handle->signum != 0) {
    uv__signal_stop(handle);
  }

  uv__signal_block_and_lock(&saved_sigmask);

  /* If at this point there are no active signal watchers for this signum (in
   * any of the loops), it's time to try and register a handler for it here.
   */
  if (uv__signal_first_handle(signum) == NULL) {
    err = uv__signal_register_handler(signum);
    if (err) {
      /* Registering the signal handler failed. Must be an invalid signal. */
      uv__signal_unlock_and_unblock(&saved_sigmask);
      return err;
    }
  }

  handle->signum = signum;
  RB_INSERT(uv__signal_tree_s, &uv__signal_tree, handle);

  uv__signal_unlock_and_unblock(&saved_sigmask);

  handle->signal_cb = signal_cb;
  uv__handle_start(handle);

  return 0;
}